

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void google::protobuf::io::Tokenizer::ParseStringAppend(string *text,string *output)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  LogMessage *in_RSI;
  ulong in_RDI;
  char *end;
  uint32 unicode;
  int code_1;
  int code;
  char *ptr;
  size_t new_len;
  size_t text_size;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  LogMessage *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  LogLevel_conflict in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  string *in_stack_ffffffffffffff38;
  int local_a0;
  char *local_98;
  string local_80 [104];
  long local_18;
  LogMessage *local_10;
  ulong local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  lVar2 = std::__cxx11::string::size();
  local_18 = lVar2;
  if (lVar2 == 0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff1c,(char *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c
              );
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff10,
               (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    CEscape(in_stack_ffffffffffffff38);
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff10,
               (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff10,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    std::__cxx11::string::~string(local_80);
    internal::LogMessage::~LogMessage((LogMessage *)0x56c048);
  }
  else {
    lVar3 = std::__cxx11::string::size();
    uVar4 = std::__cxx11::string::capacity();
    if (uVar4 < (ulong)(lVar2 + lVar3)) {
      std::__cxx11::string::reserve((ulong)local_10);
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    while (local_98 = pcVar5 + 1, *local_98 != '\0') {
      if ((*local_98 == '\\') && (pcVar5[2] != '\0')) {
        local_98 = pcVar5 + 2;
        bVar1 = anon_unknown_4::OctalDigit::InClass(*local_98);
        if (bVar1) {
          anon_unknown_4::DigitValue(*local_98);
          bVar1 = anon_unknown_4::OctalDigit::InClass(pcVar5[3]);
          if (bVar1) {
            local_98 = pcVar5 + 3;
            anon_unknown_4::DigitValue(*local_98);
          }
          bVar1 = anon_unknown_4::OctalDigit::InClass(local_98[1]);
          if (bVar1) {
            local_98 = local_98 + 1;
            anon_unknown_4::DigitValue(*local_98);
          }
          std::__cxx11::string::push_back((char)local_10);
          pcVar5 = local_98;
        }
        else if (*local_98 == 'x') {
          local_a0 = 0;
          bVar1 = anon_unknown_4::HexDigit::InClass(pcVar5[3]);
          if (bVar1) {
            local_98 = pcVar5 + 3;
            local_a0 = anon_unknown_4::DigitValue(*local_98);
          }
          bVar1 = anon_unknown_4::HexDigit::InClass(local_98[1]);
          if (bVar1) {
            local_98 = local_98 + 1;
            in_stack_ffffffffffffff1c = local_a0 << 4;
            anon_unknown_4::DigitValue(*local_98);
          }
          std::__cxx11::string::push_back((char)local_10);
          pcVar5 = local_98;
        }
        else {
          pcVar5 = local_98;
          if ((*local_98 == 'u') || (*local_98 == 'U')) {
            pcVar6 = FetchUnicodePoint((char *)CONCAT44(in_stack_ffffffffffffff1c,
                                                        in_stack_ffffffffffffff18),
                                       &in_stack_ffffffffffffff10->level_);
            if (pcVar6 == local_98) {
              std::__cxx11::string::push_back((char)local_10);
            }
            else {
              AppendUTF8((uint32)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                         (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
              pcVar5 = pcVar6 + -1;
            }
          }
          else {
            in_stack_ffffffffffffff10 = local_10;
            anon_unknown_4::TranslateEscape(*local_98);
            std::__cxx11::string::push_back((char)in_stack_ffffffffffffff10);
          }
        }
      }
      else {
        in_stack_ffffffffffffff0c = (int)*local_98;
        pcVar6 = (char *)std::__cxx11::string::operator[](local_8);
        if ((in_stack_ffffffffffffff0c != *pcVar6) ||
           (pcVar6 = pcVar5 + 2, pcVar5 = local_98, *pcVar6 != '\0')) {
          std::__cxx11::string::push_back((char)local_10);
          pcVar5 = local_98;
        }
      }
    }
  }
  return;
}

Assistant:

void Tokenizer::ParseStringAppend(const std::string& text,
                                  std::string* output) {
  // Reminder: text[0] is always a quote character.  (If text is
  // empty, it's invalid, so we'll just return).
  const size_t text_size = text.size();
  if (text_size == 0) {
    GOOGLE_LOG(DFATAL) << " Tokenizer::ParseStringAppend() passed text that could not"
                   " have been tokenized as a string: "
                << CEscape(text);
    return;
  }

  // Reserve room for new string. The branch is necessary because if
  // there is already space available the reserve() call might
  // downsize the output.
  const size_t new_len = text_size + output->size();
  if (new_len > output->capacity()) {
    output->reserve(new_len);
  }

  // Loop through the string copying characters to "output" and
  // interpreting escape sequences.  Note that any invalid escape
  // sequences or other errors were already reported while tokenizing.
  // In this case we do not need to produce valid results.
  for (const char* ptr = text.c_str() + 1; *ptr != '\0'; ptr++) {
    if (*ptr == '\\' && ptr[1] != '\0') {
      // An escape sequence.
      ++ptr;

      if (OctalDigit::InClass(*ptr)) {
        // An octal escape.  May one, two, or three digits.
        int code = DigitValue(*ptr);
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'x') {
        // A hex escape.  May zero, one, or two digits.  (The zero case
        // will have been caught as an error earlier.)
        int code = 0;
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = DigitValue(*ptr);
        }
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 16 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'u' || *ptr == 'U') {
        uint32 unicode;
        const char* end = FetchUnicodePoint(ptr, &unicode);
        if (end == ptr) {
          // Failure: Just dump out what we saw, don't try to parse it.
          output->push_back(*ptr);
        } else {
          AppendUTF8(unicode, output);
          ptr = end - 1;  // Because we're about to ++ptr.
        }
      } else {
        // Some other escape code.
        output->push_back(TranslateEscape(*ptr));
      }

    } else if (*ptr == text[0] && ptr[1] == '\0') {
      // Ignore final quote matching the starting quote.
    } else {
      output->push_back(*ptr);
    }
  }
}